

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa.c
# Opt level: O2

int mbedtls_rsa_rsaes_pkcs1_v15_decrypt
              (mbedtls_rsa_context *ctx,_func_int_void_ptr_uchar_ptr_size_t *f_rng,void *p_rng,
              int mode,size_t *olen,uchar *input,uchar *output,size_t output_max_len)

{
  long lVar1;
  ulong uVar2;
  bool bVar3;
  byte bVar4;
  int iVar5;
  long lVar6;
  int iVar7;
  ulong uVar8;
  byte bVar9;
  byte bVar10;
  uchar uVar11;
  ulong __n;
  size_t sVar12;
  undefined8 uStack_440;
  uchar buf [1024];
  
  uVar2 = ctx->len;
  __n = uVar2 - 0xb;
  if (output_max_len <= uVar2 - 0xb) {
    __n = output_max_len;
  }
  if (mode == 1) {
    if (uVar2 - 0x401 < 0xfffffffffffffc0f || ctx->padding != 0) {
      return -0x4080;
    }
LAB_00111f13:
    uStack_440 = 0x111f1e;
    iVar5 = mbedtls_rsa_private(ctx,f_rng,p_rng,input,buf);
    if (iVar5 != 0) goto LAB_001120b1;
    if (mode != 1) goto LAB_00111f85;
    bVar4 = buf[1] ^ 2 | buf[0];
    lVar6 = 0;
    bVar3 = false;
    bVar10 = 0;
    for (uVar8 = 2; uVar8 < uVar2; uVar8 = uVar8 + 1) {
      bVar9 = buf[uVar8] == '\0' | bVar10;
      lVar6 = lVar6 + (ulong)((byte)(~bVar10 & bVar9 - 1) >> 7);
      bVar3 = (bool)(buf[uVar8] == '\0' | bVar3);
      bVar10 = bVar9;
    }
  }
  else {
    if (uVar2 - 0x401 < 0xfffffffffffffc0f) {
      return -0x4080;
    }
    if (mode != 0) goto LAB_00111f13;
    uStack_440 = 0x111f7e;
    iVar5 = mbedtls_rsa_public(ctx,input,buf);
    if (iVar5 != 0) goto LAB_001120b1;
LAB_00111f85:
    bVar4 = buf[0] | buf[1] ^ 1;
    lVar6 = 0;
    bVar3 = false;
    for (uVar8 = 2; uVar8 < uVar2; uVar8 = uVar8 + 1) {
      bVar3 = (bool)(bVar3 | buf[uVar8] == 0);
      bVar10 = ~buf[uVar8];
      if (bVar3) {
        bVar10 = 0;
      }
      lVar6 = lVar6 + (ulong)!bVar3;
      bVar4 = bVar4 | bVar10;
    }
  }
  bVar3 = !bVar3;
  lVar1 = lVar6 + -8;
  sVar12 = (size_t)(((int)uVar2 - (int)lVar6) - 3);
  if ((lVar1 < 0 || bVar4 != 0) || bVar3) {
    sVar12 = __n & 0xffffffff;
  }
  lVar6 = __n - sVar12;
  iVar7 = -0x4400;
  if (-1 < lVar6) {
    iVar7 = 0;
  }
  for (uVar8 = 0xb; uVar8 < uVar2; uVar8 = uVar8 + 1) {
    uVar11 = buf[uVar8];
    if (lVar6 < 0 || ((lVar1 < 0 || bVar4 != 0) || bVar3)) {
      uVar11 = '\0';
    }
    buf[uVar8] = uVar11;
  }
  iVar5 = -0x4100;
  if ((-1 < lVar1 && bVar4 == 0) && !bVar3) {
    iVar5 = iVar7;
  }
  if (lVar6 < 0) {
    sVar12 = __n & 0xffffffff;
  }
  if (__n != 0) {
    for (uVar8 = 0; uVar8 != __n; uVar8 = uVar8 + 1) {
      lVar6 = -__n;
      while (lVar6 = lVar6 + 1, lVar6 != 0) {
        uVar11 = buf[lVar6 + (uVar2 - 0x438) + 0x438];
        if ((long)(uVar8 - sVar12) < 0) {
          uVar11 = buf[lVar6 + uVar2 + -1];
        }
        buf[lVar6 + uVar2 + -1] = uVar11;
      }
      uVar11 = buf[uVar2 - 1];
      if (-1 < (long)(uVar8 - sVar12)) {
        uVar11 = '\0';
      }
      buf[uVar2 - 1] = uVar11;
    }
  }
  if (output_max_len != 0) {
    uStack_440 = 0x1120ae;
    memcpy(output,buf + ((uVar2 - 0x438) - __n) + 0x438,__n);
  }
  *olen = sVar12;
LAB_001120b1:
  uStack_440 = 0x1120be;
  mbedtls_platform_zeroize(buf,0x400);
  return iVar5;
}

Assistant:

int mbedtls_rsa_rsaes_pkcs1_v15_decrypt( mbedtls_rsa_context *ctx,
                                 int (*f_rng)(void *, unsigned char *, size_t),
                                 void *p_rng,
                                 int mode, size_t *olen,
                                 const unsigned char *input,
                                 unsigned char *output,
                                 size_t output_max_len )
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    size_t ilen, i, plaintext_max_size;
    unsigned char buf[MBEDTLS_MPI_MAX_SIZE];
    /* The following variables take sensitive values: their value must
     * not leak into the observable behavior of the function other than
     * the designated outputs (output, olen, return value). Otherwise
     * this would open the execution of the function to
     * side-channel-based variants of the Bleichenbacher padding oracle
     * attack. Potential side channels include overall timing, memory
     * access patterns (especially visible to an adversary who has access
     * to a shared memory cache), and branches (especially visible to
     * an adversary who has access to a shared code cache or to a shared
     * branch predictor). */
    size_t pad_count = 0;
    unsigned bad = 0;
    unsigned char pad_done = 0;
    size_t plaintext_size = 0;
    unsigned output_too_large;

    RSA_VALIDATE_RET( ctx != NULL );
    RSA_VALIDATE_RET( mode == MBEDTLS_RSA_PRIVATE ||
                      mode == MBEDTLS_RSA_PUBLIC );
    RSA_VALIDATE_RET( output_max_len == 0 || output != NULL );
    RSA_VALIDATE_RET( input != NULL );
    RSA_VALIDATE_RET( olen != NULL );

    ilen = ctx->len;
    plaintext_max_size = ( output_max_len > ilen - 11 ?
                           ilen - 11 :
                           output_max_len );

    if( mode == MBEDTLS_RSA_PRIVATE && ctx->padding != MBEDTLS_RSA_PKCS_V15 )
        return( MBEDTLS_ERR_RSA_BAD_INPUT_DATA );

    if( ilen < 16 || ilen > sizeof( buf ) )
        return( MBEDTLS_ERR_RSA_BAD_INPUT_DATA );

    ret = ( mode == MBEDTLS_RSA_PUBLIC )
          ? mbedtls_rsa_public(  ctx, input, buf )
          : mbedtls_rsa_private( ctx, f_rng, p_rng, input, buf );

    if( ret != 0 )
        goto cleanup;

    /* Check and get padding length in constant time and constant
     * memory trace. The first byte must be 0. */
    bad |= buf[0];

    if( mode == MBEDTLS_RSA_PRIVATE )
    {
        /* Decode EME-PKCS1-v1_5 padding: 0x00 || 0x02 || PS || 0x00
         * where PS must be at least 8 nonzero bytes. */
        bad |= buf[1] ^ MBEDTLS_RSA_CRYPT;

        /* Read the whole buffer. Set pad_done to nonzero if we find
         * the 0x00 byte and remember the padding length in pad_count. */
        for( i = 2; i < ilen; i++ )
        {
            pad_done  |= ((buf[i] | (unsigned char)-buf[i]) >> 7) ^ 1;
            pad_count += ((pad_done | (unsigned char)-pad_done) >> 7) ^ 1;
        }
    }
    else
    {
        /* Decode EMSA-PKCS1-v1_5 padding: 0x00 || 0x01 || PS || 0x00
         * where PS must be at least 8 bytes with the value 0xFF. */
        bad |= buf[1] ^ MBEDTLS_RSA_SIGN;

        /* Read the whole buffer. Set pad_done to nonzero if we find
         * the 0x00 byte and remember the padding length in pad_count.
         * If there's a non-0xff byte in the padding, the padding is bad. */
        for( i = 2; i < ilen; i++ )
        {
            pad_done |= if_int( buf[i], 0, 1 );
            pad_count += if_int( pad_done, 0, 1 );
            bad |= if_int( pad_done, 0, buf[i] ^ 0xFF );
        }
    }

    /* If pad_done is still zero, there's no data, only unfinished padding. */
    bad |= if_int( pad_done, 0, 1 );

    /* There must be at least 8 bytes of padding. */
    bad |= size_greater_than( 8, pad_count );

    /* If the padding is valid, set plaintext_size to the number of
     * remaining bytes after stripping the padding. If the padding
     * is invalid, avoid leaking this fact through the size of the
     * output: use the maximum message size that fits in the output
     * buffer. Do it without branches to avoid leaking the padding
     * validity through timing. RSA keys are small enough that all the
     * size_t values involved fit in unsigned int. */
    plaintext_size = if_int( bad,
                             (unsigned) plaintext_max_size,
                             (unsigned) ( ilen - pad_count - 3 ) );

    /* Set output_too_large to 0 if the plaintext fits in the output
     * buffer and to 1 otherwise. */
    output_too_large = size_greater_than( plaintext_size,
                                          plaintext_max_size );

    /* Set ret without branches to avoid timing attacks. Return:
     * - INVALID_PADDING if the padding is bad (bad != 0).
     * - OUTPUT_TOO_LARGE if the padding is good but the decrypted
     *   plaintext does not fit in the output buffer.
     * - 0 if the padding is correct. */
    ret = - (int) if_int( bad, - MBEDTLS_ERR_RSA_INVALID_PADDING,
                  if_int( output_too_large, - MBEDTLS_ERR_RSA_OUTPUT_TOO_LARGE,
                          0 ) );

    /* If the padding is bad or the plaintext is too large, zero the
     * data that we're about to copy to the output buffer.
     * We need to copy the same amount of data
     * from the same buffer whether the padding is good or not to
     * avoid leaking the padding validity through overall timing or
     * through memory or cache access patterns. */
    bad = all_or_nothing_int( bad | output_too_large );
    for( i = 11; i < ilen; i++ )
        buf[i] &= ~bad;

    /* If the plaintext is too large, truncate it to the buffer size.
     * Copy anyway to avoid revealing the length through timing, because
     * revealing the length is as bad as revealing the padding validity
     * for a Bleichenbacher attack. */
    plaintext_size = if_int( output_too_large,
                             (unsigned) plaintext_max_size,
                             (unsigned) plaintext_size );

    /* Move the plaintext to the leftmost position where it can start in
     * the working buffer, i.e. make it start plaintext_max_size from
     * the end of the buffer. Do this with a memory access trace that
     * does not depend on the plaintext size. After this move, the
     * starting location of the plaintext is no longer sensitive
     * information. */
    mem_move_to_left( buf + ilen - plaintext_max_size,
                      plaintext_max_size,
                      plaintext_max_size - plaintext_size );

    /* Finally copy the decrypted plaintext plus trailing zeros into the output
     * buffer. If output_max_len is 0, then output may be an invalid pointer
     * and the result of memcpy() would be undefined; prevent undefined
     * behavior making sure to depend only on output_max_len (the size of the
     * user-provided output buffer), which is independent from plaintext
     * length, validity of padding, success of the decryption, and other
     * secrets. */
    if( output_max_len != 0 )
        memcpy( output, buf + ilen - plaintext_max_size, plaintext_max_size );

    /* Report the amount of data we copied to the output buffer. In case
     * of errors (bad padding or output too large), the value of *olen
     * when this function returns is not specified. Making it equivalent
     * to the good case limits the risks of leaking the padding validity. */
    *olen = plaintext_size;

cleanup:
    mbedtls_platform_zeroize( buf, sizeof( buf ) );

    return( ret );
}